

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O0

xmlXPathObjectPtr xmlXPtrNewRangeNodePoint(xmlNodePtr start,xmlXPathObjectPtr end)

{
  xmlXPathObjectPtr ret;
  xmlXPathObjectPtr end_local;
  xmlNodePtr start_local;
  
  if (start == (xmlNodePtr)0x0) {
    start_local = (xmlNodePtr)0x0;
  }
  else if (end == (xmlXPathObjectPtr)0x0) {
    start_local = (xmlNodePtr)0x0;
  }
  else if (end->type == XPATH_POINT) {
    start_local = (xmlNodePtr)xmlXPtrNewRangeInternal(start,-1,(xmlNodePtr)end->user,end->index);
    xmlXPtrRangeCheckOrder((xmlXPathObjectPtr)start_local);
  }
  else {
    start_local = (xmlNodePtr)0x0;
  }
  return (xmlXPathObjectPtr)start_local;
}

Assistant:

xmlXPathObjectPtr
xmlXPtrNewRangeNodePoint(xmlNodePtr start, xmlXPathObjectPtr end) {
    xmlXPathObjectPtr ret;

    if (start == NULL)
	return(NULL);
    if (end == NULL)
	return(NULL);
    if (end->type != XPATH_POINT)
	return(NULL);

    ret = xmlXPtrNewRangeInternal(start, -1, end->user, end->index);
    xmlXPtrRangeCheckOrder(ret);
    return(ret);
}